

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O3

void __thiscall
CItems::RenderFlag(CItems *this,CNetObj_Flag *pPrev,CNetObj_Flag *pCurrent,
                  CNetObj_GameDataFlag *pPrevGameDataFlag,CNetObj_GameDataFlag *pCurGameDataFlag)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  IGraphics *pIVar7;
  bool bVar8;
  uint ClientID;
  CGameClient *this_00;
  long in_FS_OFFSET;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar9;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar10;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_44;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_30;
  float local_2c;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_CComponent).m_pClient;
  uVar2 = pPrev->m_X;
  uVar4 = pPrev->m_Y;
  uVar3 = pCurrent->m_X;
  uVar5 = pCurrent->m_Y;
  aVar9.x = (float)(int)uVar3;
  aVar10.y = (float)(int)uVar5;
  fVar1 = this_00->m_pClient->m_GameIntraTick;
  local_48.x = fVar1 * (aVar9.x - (float)(int)uVar2) + (float)(int)uVar2;
  aStack_44.y = fVar1 * (aVar10.y - (float)(int)uVar4) + (float)(int)uVar4;
  if (pCurGameDataFlag != (CNetObj_GameDataFlag *)0x0) {
    iVar6 = pCurrent->m_Team;
    if (pPrevGameDataFlag == (CNetObj_GameDataFlag *)0x0) {
      if (iVar6 == 1) goto LAB_00149d1e;
      aVar9.x = local_48.x;
      aVar10.y = aStack_44.y;
      if (iVar6 == 0) {
LAB_00149d0a:
        ClientID = pCurGameDataFlag->m_FlagCarrierRed;
        local_48 = aVar9;
        aStack_44 = aVar10;
        goto LAB_00149d22;
      }
    }
    else {
      if (iVar6 == 1) {
        if (pPrevGameDataFlag->m_FlagCarrierBlue != pCurGameDataFlag->m_FlagCarrierBlue) {
          local_48.x = aVar9.x;
          aStack_44.y = aVar10.y;
        }
LAB_00149d1e:
        ClientID = pCurGameDataFlag->m_FlagCarrierBlue;
      }
      else {
        if (iVar6 != 0) goto LAB_00149d61;
        ClientID = pCurGameDataFlag->m_FlagCarrierRed;
        if (pPrevGameDataFlag->m_FlagCarrierRed != ClientID) goto LAB_00149d0a;
      }
LAB_00149d22:
      if (-1 < (int)ClientID) {
        if (ClientID < 0x40) {
          bVar8 = CGameClient::ShouldUsePredicted(this_00);
          this_00 = (this->super_CComponent).m_pClient;
          if (bVar8) {
            bVar8 = CGameClient::ShouldUsePredictedChar(this_00,ClientID);
            this_00 = (this->super_CComponent).m_pClient;
            if (bVar8) {
              _local_48 = CGameClient::GetCharPos(this_00,ClientID,true);
              this_00 = (this->super_CComponent).m_pClient;
            }
          }
        }
        goto LAB_00149d65;
      }
    }
  }
LAB_00149d61:
LAB_00149d65:
  (*(this_00->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])();
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])();
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,(pCurrent->m_Team == 0) + 0x3f,0,0
             ,0);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])(0)
  ;
  local_2c = aStack_44.y + -31.5;
  local_30 = local_48;
  local_28 = 0x42a8000042280000;
  pIVar7 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar7->super_IInterface)._vptr_IInterface[0x1c])(pIVar7,&local_30,1);
  (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderFlag(const CNetObj_Flag *pPrev, const CNetObj_Flag *pCurrent, const CNetObj_GameDataFlag *pPrevGameDataFlag, const CNetObj_GameDataFlag *pCurGameDataFlag)
{
	const float Size = 42.0f;
	vec2 Pos = mix(vec2(pPrev->m_X, pPrev->m_Y), vec2(pCurrent->m_X, pCurrent->m_Y), Client()->IntraGameTick());

	if(pCurGameDataFlag)
	{
		// make sure that the flag isn't interpolated between capture and return
		if(pPrevGameDataFlag &&
			((pCurrent->m_Team == TEAM_RED && pPrevGameDataFlag->m_FlagCarrierRed != pCurGameDataFlag->m_FlagCarrierRed) ||
			(pCurrent->m_Team == TEAM_BLUE && pPrevGameDataFlag->m_FlagCarrierBlue != pCurGameDataFlag->m_FlagCarrierBlue)))
			Pos = vec2(pCurrent->m_X, pCurrent->m_Y);

		int FlagCarrier = -1;
		if(pCurrent->m_Team == TEAM_RED && pCurGameDataFlag->m_FlagCarrierRed >= 0)
			FlagCarrier = pCurGameDataFlag->m_FlagCarrierRed;
		else if(pCurrent->m_Team == TEAM_BLUE && pCurGameDataFlag->m_FlagCarrierBlue >= 0)
			FlagCarrier = pCurGameDataFlag->m_FlagCarrierBlue;

		// make sure to use predicted position
		if(FlagCarrier >= 0 && FlagCarrier < MAX_CLIENTS && m_pClient->ShouldUsePredicted() && m_pClient->ShouldUsePredictedChar(FlagCarrier))
			Pos = m_pClient->GetCharPos(FlagCarrier, true);
	}

	Graphics()->BlendNormal();
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	RenderTools()->SelectSprite(pCurrent->m_Team == TEAM_RED ? SPRITE_FLAG_RED : SPRITE_FLAG_BLUE);
	Graphics()->QuadsSetRotation(0.0f);
	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y-Size*0.75f, Size, Size*2);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsEnd();
}